

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlParseChunk(htmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  xmlChar **ppxVar1;
  int *piVar2;
  byte bVar3;
  setDocumentLocatorSAXFunc p_Var4;
  xmlChar *pxVar5;
  endElementSAXFunc p_Var6;
  __int32_t *p_Var7;
  endDocumentSAXFunc p_Var8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  xmlParserInputState xVar12;
  size_t sVar13;
  xmlSAXLocator *pxVar14;
  void *pvVar15;
  __int32_t **pp_Var16;
  _xmlSAXHandler *p_Var17;
  charactersSAXFunc p_Var18;
  byte *pbVar19;
  xmlDtdPtr pxVar20;
  xmlChar *pxVar21;
  char *pcVar22;
  xmlParserErrors error;
  code *in_R8;
  xmlChar *pxVar23;
  xmlParserInputPtr pxVar24;
  byte bVar25;
  ulong uVar26;
  bool bVar27;
  htmlParserNodeInfo node_info;
  ushort local_5e;
  uint local_5c;
  htmlParserNodeInfo local_58;
  
  if (ctxt == (htmlParserCtxtPtr)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,5,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,(char *)0x0,
                    0,0,"htmlParseChunk: context error\n",0,0);
    return 1;
  }
  pxVar24 = ctxt->input;
  if (pxVar24 == (xmlParserInputPtr)0x0) {
    pcVar22 = "htmlParseChunk: context error\n";
    iVar11 = 1;
    error = XML_ERR_INTERNAL_ERROR;
LAB_0014dea5:
    htmlParseErr(ctxt,error,pcVar22,(xmlChar *)0x0,(xmlChar *)0x0);
    return iVar11;
  }
  if (((chunk == (char *)0x0 || size < 1) || (pxVar24->buf == (xmlParserInputBufferPtr)0x0)) ||
     (ctxt->instate == XML_PARSER_EOF)) {
    if (((ctxt->instate != XML_PARSER_EOF) &&
        (chunk = (char *)pxVar24->buf,
        (xmlParserInputBufferPtr)chunk != (xmlParserInputBufferPtr)0x0)) &&
       ((((xmlParserInputBufferPtr)chunk)->encoder != (xmlCharEncodingHandlerPtr)0x0 &&
        ((((xmlParserInputBufferPtr)chunk)->buffer != (xmlBufPtr)0x0 &&
         (((xmlParserInputBufferPtr)chunk)->raw != (xmlBufPtr)0x0)))))) {
      sVar13 = xmlBufGetInputBase(((xmlParserInputBufferPtr)chunk)->buffer,pxVar24);
      pxVar21 = ctxt->input->cur;
      pxVar23 = ctxt->input->base;
      iVar11 = xmlCharEncInput((xmlParserInputBufferPtr)chunk,terminate);
      xmlBufSetInputBaseCur
                (((xmlParserInputBufferPtr)chunk)->buffer,ctxt->input,sVar13,
                 (long)pxVar21 - (long)pxVar23);
      if (iVar11 < 0) {
        pcVar22 = "encoder error\n";
        iVar11 = 0x51;
        error = XML_ERR_INVALID_ENCODING;
        goto LAB_0014dea5;
      }
    }
  }
  else {
    sVar13 = xmlBufGetInputBase(pxVar24->buf->buffer,pxVar24);
    pxVar24 = ctxt->input;
    pxVar21 = pxVar24->cur;
    pxVar23 = pxVar24->base;
    uVar10 = xmlParserInputBufferPush(pxVar24->buf,size,chunk);
    chunk = (char *)(ulong)uVar10;
    xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar13,(long)pxVar21 - (long)pxVar23)
    ;
    if ((int)uVar10 < 0) {
      ctxt->errNo = -1;
      ctxt->disableSAX = 1;
      return -1;
    }
  }
  pxVar24 = ctxt->input;
  bVar27 = true;
  if (pxVar24 == (xmlParserInputPtr)0x0) goto LAB_0014ded5;
  uVar26 = CONCAT71((int7)((ulong)chunk >> 8),terminate != 0);
LAB_0014d145:
  if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
    sVar13 = (size_t)pxVar24->length;
  }
  else {
    sVar13 = xmlBufUse(pxVar24->buf->buffer);
  }
  pxVar21 = pxVar24->base;
  pbVar19 = pxVar24->cur;
  pxVar23 = pxVar21 + (sVar13 - (long)pbVar19);
  if ((terminate != 0) && (pxVar23 == (xmlChar *)0x0)) {
    htmlAutoCloseOnEnd(ctxt);
    if (ctxt->nameNr == 0) {
      bVar27 = true;
      if (ctxt->instate != XML_PARSER_EOF) {
        ctxt->instate = XML_PARSER_EOF;
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
          (*p_Var8)(ctxt->userData);
        }
      }
    }
    else {
      bVar27 = true;
    }
    goto LAB_0014ded5;
  }
  if ((long)pxVar23 < 1) goto LAB_0014deb4;
  bVar25 = *pbVar19;
  if (bVar25 == 0) {
    pxVar24 = ctxt->input;
    ppxVar1 = &pxVar24->cur;
    *ppxVar1 = *ppxVar1 + 1;
    piVar2 = &pxVar24->col;
    *piVar2 = *piVar2 + 1;
    goto switchD_0014d1a3_default;
  }
  uVar10 = (uint)uVar26;
  switch(ctxt->instate) {
  case XML_PARSER_START:
    if ((bVar25 < 0x21) && ((0x100002600U >> ((ulong)bVar25 & 0x3f) & 1) != 0)) {
      htmlSkipBlankChars(ctxt);
      if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
        sVar13 = (size_t)pxVar24->length;
      }
      else {
        sVar13 = xmlBufUse(pxVar24->buf->buffer);
      }
      pxVar23 = pxVar24->base + (sVar13 - (long)pxVar24->cur);
    }
    p_Var17 = ctxt->sax;
    if (p_Var17 != (_xmlSAXHandler *)0x0) {
      p_Var4 = p_Var17->setDocumentLocator;
      if (p_Var4 != (setDocumentLocatorSAXFunc)0x0) {
        pvVar15 = ctxt->userData;
        local_5c = uVar10;
        pxVar14 = __xmlDefaultSAXLocator();
        uVar26 = (ulong)local_5c;
        (*p_Var4)(pvVar15,pxVar14);
        p_Var17 = ctxt->sax;
        if (p_Var17 == (_xmlSAXHandler *)0x0) goto LAB_0014d7c4;
      }
      if ((p_Var17->startDocument != (startDocumentSAXFunc)0x0) && (ctxt->disableSAX == 0)) {
        (*p_Var17->startDocument)(ctxt->userData);
      }
    }
LAB_0014d7c4:
    if ((*pxVar24->cur == '<') && (pxVar24->cur[1] == '!')) {
      pp_Var16 = __ctype_toupper_loc();
      p_Var7 = *pp_Var16;
      pxVar21 = ctxt->input->cur;
      if (((p_Var7[pxVar21[2]] == 0x44) &&
          ((((p_Var7[pxVar21[3]] == 0x4f && (p_Var7[pxVar21[4]] == 0x43)) &&
            (p_Var7[pxVar21[5]] == 0x54)) &&
           ((p_Var7[pxVar21[6]] == 0x59 && (p_Var7[pxVar21[7]] == 0x50)))))) &&
         (p_Var7[pxVar21[8]] == 0x45)) {
joined_r0x0014d8ea:
        if ((terminate != 0) ||
           (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar11)) {
          htmlParseDocTypeDecl(ctxt);
          goto LAB_0014d687;
        }
        goto LAB_0014e055;
      }
    }
    ctxt->instate = XML_PARSER_MISC;
    goto switchD_0014d1a3_default;
  case XML_PARSER_MISC:
    htmlSkipBlankChars(ctxt);
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar13 = (size_t)pxVar24->length;
    }
    else {
      sVar13 = xmlBufUse(pxVar24->buf->buffer);
    }
    pbVar19 = pxVar24->cur;
    pxVar23 = pxVar24->base + (sVar13 - (long)pbVar19);
    if ((long)pxVar23 < 1) goto LAB_0014deb4;
    if (pxVar23 == &DAT_00000001) {
      if (terminate != 0) goto LAB_0014dd62;
    }
    else {
      if (pbVar19[1] == 0x21 && (*pbVar19 ^ 0x3c) == 0) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate != 0) || (iVar11 = htmlParseLookupCommentEnd(ctxt), -1 < iVar11)) {
            htmlParseComment(ctxt);
LAB_0014d883:
            ctxt->instate = XML_PARSER_MISC;
            goto switchD_0014d1a3_default;
          }
          goto LAB_0014e055;
        }
        pp_Var16 = __ctype_toupper_loc();
        p_Var7 = *pp_Var16;
        pxVar21 = ctxt->input->cur;
        if (((p_Var7[pxVar21[2]] == 0x44) &&
            (((p_Var7[pxVar21[3]] == 0x4f && (p_Var7[pxVar21[4]] == 0x43)) &&
             (p_Var7[pxVar21[5]] == 0x54)))) &&
           (((p_Var7[pxVar21[6]] == 0x59 && (p_Var7[pxVar21[7]] == 0x50)) &&
            (p_Var7[pxVar21[8]] == 0x45)))) goto joined_r0x0014d8ea;
        if (&DAT_00000008 < pxVar23) goto LAB_0014dd62;
        goto switchD_0014d1a3_caseD_ffffffff;
      }
      if ((*pbVar19 ^ 0x3c) != 0 || pbVar19[1] != 0x3f) goto LAB_0014dd62;
      if ((terminate != 0) ||
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)) {
        htmlParsePI(ctxt);
        goto LAB_0014d883;
      }
    }
    goto LAB_0014e055;
  case XML_PARSER_PI:
    pcVar22 = "HPP: internal error, state == PI\n";
    break;
  case XML_PARSER_DTD:
    pcVar22 = "HPP: internal error, state == DTD\n";
    break;
  case XML_PARSER_PROLOG:
    htmlSkipBlankChars(ctxt);
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar13 = (size_t)pxVar24->length;
    }
    else {
      sVar13 = xmlBufUse(pxVar24->buf->buffer);
    }
    pbVar19 = pxVar24->cur;
    pxVar23 = pxVar24->base + (sVar13 - (long)pbVar19);
    if (1 < (long)pxVar23) {
      if (pbVar19[1] == 0x21 && (*pbVar19 ^ 0x3c) == 0) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate == 0) && (iVar11 = htmlParseLookupCommentEnd(ctxt), iVar11 < 0))
          goto LAB_0014e055;
          htmlParseComment(ctxt);
LAB_0014d687:
          ctxt->instate = XML_PARSER_PROLOG;
          goto switchD_0014d1a3_default;
        }
        if (pxVar23 <= &DAT_00000003) goto switchD_0014d1a3_caseD_ffffffff;
      }
      else if ((*pbVar19 ^ 0x3c) == 0 && pbVar19[1] == 0x3f) {
        if ((terminate != 0) ||
           (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)) {
          htmlParsePI(ctxt);
          goto LAB_0014d687;
        }
        goto LAB_0014e055;
      }
LAB_0014dd62:
      ctxt->instate = XML_PARSER_CONTENT;
      goto switchD_0014d1a3_default;
    }
    goto LAB_0014deb4;
  case XML_PARSER_COMMENT:
    pcVar22 = "HPP: internal error, state == COMMENT\n";
    break;
  case XML_PARSER_START_TAG:
    if (pxVar23 != &DAT_00000001) {
      if (bVar25 != 0x3c) goto LAB_0014dd62;
      if (pbVar19[1] == 0x2f) {
        ctxt->instate = XML_PARSER_END_TAG;
        goto LAB_0014d491;
      }
      if ((terminate != 0) ||
         (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar11))
      goto LAB_0014d944;
      goto LAB_0014e055;
    }
    if (terminate == 0) goto LAB_0014e055;
    if (bVar25 != 0x3c) goto LAB_0014dd62;
LAB_0014d944:
    if (ctxt->record_info != 0) {
      pxVar24 = ctxt->input;
      local_58.begin_pos = (unsigned_long)(pxVar24->cur + (pxVar24->consumed - (long)pxVar24->base))
      ;
      local_58.begin_line = (unsigned_long)pxVar24->line;
    }
    iVar11 = htmlParseStartTag(ctxt);
    pxVar21 = ctxt->name;
    if (pxVar21 != (xmlChar *)0x0 && iVar11 != -1) {
      uVar26 = uVar26 & 0xffffffff;
      in_R8 = htmlCompareTags;
      pvVar15 = bsearch(pxVar21,html40ElementTable,0x5c,0x40,htmlCompareTags);
      if (pvVar15 == (void *)0x0) {
        in_R8 = (code *)0x0;
        htmlParseErr(ctxt,XML_HTML_UNKNOWN_TAG,"Tag %s invalid\n",pxVar21,(xmlChar *)0x0);
      }
      pxVar24 = ctxt->input;
      pxVar5 = pxVar24->cur;
      if (*pxVar5 != '>') {
        if ((*pxVar5 == '/') && (pxVar5[1] == '>')) {
          pxVar24->cur = pxVar5 + 2;
          pxVar24->col = pxVar24->col + 2;
          if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
             (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
            (*p_Var6)(ctxt->userData,pxVar21);
          }
          iVar11 = ctxt->nameNr;
          if (0 < (long)iVar11) {
            ctxt->nameNr = iVar11 - 1U;
            if (iVar11 == 1) {
              pxVar21 = (xmlChar *)0x0;
            }
            else {
              pxVar21 = ctxt->nameTab[(long)iVar11 + -2];
            }
            ctxt->name = pxVar21;
            ctxt->nameTab[iVar11 - 1U] = (xmlChar *)0x0;
          }
        }
        else {
          in_R8 = (code *)0x0;
          htmlParseErr(ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s\n",pxVar21,
                       (xmlChar *)0x0);
          iVar11 = xmlStrEqual(pxVar21,ctxt->name);
          if (iVar11 != 0) {
            nodePop(ctxt);
            iVar11 = ctxt->nameNr;
            if (0 < (long)iVar11) {
              ctxt->nameNr = iVar11 - 1U;
              if (iVar11 == 1) {
                pxVar21 = (xmlChar *)0x0;
              }
              else {
                pxVar21 = ctxt->nameTab[(long)iVar11 + -2];
              }
              ctxt->name = pxVar21;
              ctxt->nameTab[iVar11 - 1U] = (xmlChar *)0x0;
            }
          }
          if (ctxt->record_info != 0) {
            htmlNodeInfoPush(ctxt,&local_58);
          }
        }
        goto LAB_0014dd62;
      }
      xmlNextChar(ctxt);
      if ((pvVar15 != (void *)0x0) && (*(char *)((long)pvVar15 + 0xb) != '\0')) {
        if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
           (p_Var6 = ctxt->sax->endElement, p_Var6 != (endElementSAXFunc)0x0)) {
          (*p_Var6)(ctxt->userData,pxVar21);
        }
        iVar11 = ctxt->nameNr;
        if (0 < (long)iVar11) {
          ctxt->nameNr = iVar11 - 1U;
          if (iVar11 == 1) {
            pxVar21 = (xmlChar *)0x0;
          }
          else {
            pxVar21 = ctxt->nameTab[(long)iVar11 + -2];
          }
          ctxt->name = pxVar21;
          ctxt->nameTab[iVar11 - 1U] = (xmlChar *)0x0;
        }
      }
      if (ctxt->record_info != 0) {
        htmlNodeInfoPush(ctxt,&local_58);
      }
      ctxt->instate = XML_PARSER_CONTENT;
      goto switchD_0014d1a3_default;
    }
    pxVar24 = ctxt->input;
    if (*pxVar24->cur == '>') {
      xmlNextChar(ctxt);
      goto switchD_0014d1a3_default;
    }
    goto LAB_0014d4a0;
  case XML_PARSER_CONTENT:
    local_5e = 0;
    if (ctxt->token != 0) {
      local_5e = (ushort)(byte)ctxt->token;
      htmlCheckParagraph(ctxt);
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var18 = ctxt->sax->characters, p_Var18 != (charactersSAXFunc)0x0)) {
        (*p_Var18)(ctxt->userData,(xmlChar *)&local_5e,1);
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
    }
    if ((terminate == 0) || (pxVar23 != &DAT_00000001)) {
      local_5c = uVar10;
      if (pxVar23 == &DAT_00000001) goto LAB_0014e05d;
      bVar25 = *pxVar24->cur;
      bVar3 = pxVar24->cur[1];
      iVar11 = xmlStrEqual(ctxt->name,"script");
      if ((iVar11 == 0) && (iVar11 = xmlStrEqual(ctxt->name,"style"), iVar11 == 0)) {
        bVar9 = bVar25 ^ 0x3c;
        if (bVar3 == 0x21 && bVar9 == 0) {
          pp_Var16 = __ctype_toupper_loc();
          p_Var7 = *pp_Var16;
          pxVar21 = ctxt->input->cur;
          if (((((p_Var7[pxVar21[2]] == 0x44) && (p_Var7[pxVar21[3]] == 0x4f)) &&
               (p_Var7[pxVar21[4]] == 0x43)) &&
              ((p_Var7[pxVar21[5]] == 0x54 && (p_Var7[pxVar21[6]] == 0x59)))) &&
             ((p_Var7[pxVar21[7]] == 0x50 && (p_Var7[pxVar21[8]] == 0x45)))) {
            if ((terminate != 0) ||
               (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\x01',(int)in_R8), -1 < iVar11)) {
              in_R8 = (code *)0x0;
              htmlParseErr(ctxt,XML_HTML_STRUCURE_ERROR,"Misplaced DOCTYPE declaration\n",
                           (xmlChar *)"DOCTYPE",(xmlChar *)0x0);
              htmlParseDocTypeDecl(ctxt);
              goto LAB_0014dc58;
            }
          }
          else if ((pxVar24->cur[2] == '-') && (pxVar24->cur[3] == '-')) {
            if ((terminate != 0) || (iVar11 = htmlParseLookupCommentEnd(ctxt), -1 < iVar11)) {
              htmlParseComment(ctxt);
              goto LAB_0014dcc3;
            }
          }
          else if ((terminate != 0) ||
                  (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)) {
            htmlSkipBogusComment(ctxt);
            goto LAB_0014dc58;
          }
          goto LAB_0014e05d;
        }
        if (bVar3 == 0x3f && bVar9 == 0) {
          if ((terminate == 0) &&
             (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), iVar11 < 0))
          goto LAB_0014e05d;
          htmlParsePI(ctxt);
LAB_0014dcc3:
          ctxt->instate = XML_PARSER_CONTENT;
        }
        else if (bVar9 == 0 && bVar3 == 0x2f) {
          ctxt->instate = XML_PARSER_END_TAG;
LAB_0014dd35:
          ctxt->checkIndex = 0;
        }
        else if (bVar25 == 0x3c) {
          if ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) {
            ctxt->instate = XML_PARSER_START_TAG;
            goto LAB_0014dd35;
          }
          if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
             (p_Var18 = ctxt->sax->characters, p_Var18 != (charactersSAXFunc)0x0)) {
            (*p_Var18)(ctxt->userData,"<",1);
          }
          xmlNextChar(ctxt);
        }
        else {
          if ((terminate == 0) &&
             (iVar11 = htmlParseLookupSequence(ctxt,'<','\0','\0',(int)in_R8), iVar11 < 0))
          goto LAB_0014e05d;
          ctxt->checkIndex = 0;
          if (ctxt->instate != XML_PARSER_EOF) {
            pbVar19 = pxVar24->cur;
            do {
              if (pxVar24->end <= pbVar19) break;
              if (bVar25 == 0x26) {
                htmlParseReference(ctxt);
              }
              else {
                htmlParseCharData(ctxt);
              }
              if (ctxt->instate == XML_PARSER_EOF) break;
              pbVar19 = pxVar24->cur;
              bVar25 = *pbVar19;
            } while (bVar25 != 0x3c);
          }
        }
      }
      else {
        if (terminate == 0) {
          uVar10 = htmlParseLookupSequence(ctxt,'<','/','\0',(int)in_R8);
          if ((int)uVar10 < 0) goto LAB_0014e05d;
          if (pxVar24->cur[(ulong)uVar10 + 2] == '\0') goto LAB_0014e055;
        }
        htmlParseScript(ctxt);
        if (bVar3 == 0x2f && bVar25 == 0x3c) {
          ctxt->instate = XML_PARSER_END_TAG;
          ctxt->checkIndex = 0;
        }
      }
    }
    else {
      bVar25 = *pxVar24->cur;
      local_5c = uVar10;
      if ((bVar25 == 0x26) || (bVar25 == 0x3c)) {
LAB_0014e05d:
        uVar26 = (ulong)local_5c;
        goto switchD_0014d1a3_caseD_ffffffff;
      }
      p_Var17 = ctxt->sax;
      if (p_Var17 != (_xmlSAXHandler *)0x0) {
        local_5e = CONCAT11(local_5e._1_1_,bVar25);
        if ((bVar25 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar25 & 0x3f) & 1) != 0)) {
          if (ctxt->keepBlanks != 0) goto LAB_0014dc23;
          p_Var18 = p_Var17->ignorableWhitespace;
        }
        else {
          htmlCheckParagraph(ctxt);
          p_Var17 = ctxt->sax;
LAB_0014dc23:
          p_Var18 = p_Var17->characters;
        }
        if (p_Var18 != (charactersSAXFunc)0x0) {
          (*p_Var18)(ctxt->userData,(xmlChar *)&local_5e,1);
        }
      }
      ctxt->token = 0;
      ctxt->checkIndex = 0;
      pxVar24->cur = pxVar24->cur + 1;
    }
LAB_0014dc58:
    uVar26 = (ulong)local_5c;
    goto switchD_0014d1a3_default;
  case XML_PARSER_CDATA_SECTION:
    pcVar22 = "HPP: internal error, state == CDATA\n";
    break;
  case XML_PARSER_END_TAG:
    if (pxVar23 == &DAT_00000001) goto switchD_0014d1a3_caseD_ffffffff;
    if ((terminate != 0) ||
       (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)) {
      htmlParseEndTag(ctxt);
      xVar12 = XML_PARSER_CONTENT;
      if (ctxt->nameNr == 0) {
        xVar12 = XML_PARSER_EPILOG;
      }
      ctxt->instate = xVar12;
      goto LAB_0014d491;
    }
LAB_0014e055:
    uVar26 = 0;
    goto switchD_0014d1a3_caseD_ffffffff;
  case XML_PARSER_ENTITY_DECL:
    pcVar22 = "HPP: internal error, state == ENTITY_DECL\n";
    break;
  case XML_PARSER_ENTITY_VALUE:
    pcVar22 = "HPP: internal error, state == ENTITY_VALUE\n";
    break;
  case XML_PARSER_ATTRIBUTE_VALUE:
    in_R8 = (code *)0x0;
    htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,"HPP: internal error, state == ATTRIBUTE_VALUE\n",
                 (xmlChar *)0x0,(xmlChar *)0x0);
    ctxt->instate = XML_PARSER_START_TAG;
    goto LAB_0014d491;
  case XML_PARSER_SYSTEM_LITERAL:
    pcVar22 = "HPP: internal error, state == XML_PARSER_SYSTEM_LITERAL\n";
    break;
  case XML_PARSER_EPILOG:
    if (pxVar24->buf == (xmlParserInputBufferPtr)0x0) {
      sVar13 = (size_t)pxVar24->length;
    }
    else {
      sVar13 = xmlBufUse(pxVar24->buf->buffer);
      pxVar21 = pxVar24->base;
      pbVar19 = pxVar24->cur;
    }
    pxVar23 = pxVar21 + (sVar13 - (long)pbVar19);
    if (0 < (long)pxVar23) {
      bVar25 = *pbVar19;
      if (((ulong)bVar25 < 0x21) && ((0x100002600U >> ((ulong)bVar25 & 0x3f) & 1) != 0)) {
        htmlParseCharData(ctxt);
        goto switchD_0014d1a3_caseD_ffffffff;
      }
      if (pxVar23 == &DAT_00000001) goto switchD_0014d1a3_caseD_ffffffff;
      if (pbVar19[1] == 0x21 && bVar25 == 0x3c) {
        if ((pbVar19[2] == 0x2d) && (pbVar19[3] == 0x2d)) {
          if ((terminate == 0) && (iVar11 = htmlParseLookupCommentEnd(ctxt), iVar11 < 0))
          goto LAB_0014e055;
          htmlParseComment(ctxt);
LAB_0014d74d:
          ctxt->instate = XML_PARSER_EPILOG;
          goto switchD_0014d1a3_default;
        }
        if (pxVar23 < &DAT_00000004) goto switchD_0014d1a3_caseD_ffffffff;
      }
      else if ((bVar25 == 0x3c) && (pbVar19[1] == 0x3f)) {
        if ((terminate != 0) ||
           (iVar11 = htmlParseLookupSequence(ctxt,'>','\0','\0',(int)in_R8), -1 < iVar11)) {
          htmlParsePI(ctxt);
          goto LAB_0014d74d;
        }
        goto LAB_0014e055;
      }
      ctxt->errNo = 5;
      ctxt->wellFormed = 0;
      goto LAB_0014dfc3;
    }
    goto LAB_0014deb4;
  case XML_PARSER_IGNORE:
    pcVar22 = "HPP: internal error, state == XML_PARSER_IGNORE\n";
    break;
  case XML_PARSER_PUBLIC_LITERAL:
    pcVar22 = "HPP: internal error, state == XML_PARSER_LITERAL\n";
    break;
  case XML_PARSER_EOF:
    goto switchD_0014d1a3_caseD_ffffffff;
  default:
    goto switchD_0014d1a3_default;
  }
  in_R8 = (code *)0x0;
  htmlParseErr(ctxt,XML_ERR_INTERNAL_ERROR,pcVar22,(xmlChar *)0x0,(xmlChar *)0x0);
  ctxt->instate = XML_PARSER_CONTENT;
LAB_0014d491:
  ctxt->checkIndex = 0;
switchD_0014d1a3_default:
  pxVar24 = ctxt->input;
LAB_0014d4a0:
  if (pxVar24 == (xmlParserInputPtr)0x0) goto LAB_0014deb4;
  goto LAB_0014d145;
LAB_0014deb4:
  bVar27 = pxVar23 == (xmlChar *)0x0;
LAB_0014ded5:
  uVar26 = (ulong)(terminate != 0);
  if ((terminate != 0) && (bVar27)) {
    htmlAutoCloseOnEnd(ctxt);
    uVar26 = 1;
    if ((ctxt->nameNr == 0) && (ctxt->instate != XML_PARSER_EOF)) {
LAB_0014dfc3:
      ctxt->instate = XML_PARSER_EOF;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
        (*p_Var8)(ctxt->userData);
      }
    }
  }
switchD_0014d1a3_caseD_ffffffff:
  if (((((ctxt->options & 4) == 0) && (ctxt->myDoc != (xmlDoc *)0x0)) &&
      (((char)uVar26 != '\0' ||
       ((ctxt->instate == XML_PARSER_EPILOG || (ctxt->instate == XML_PARSER_EOF)))))) &&
     (pxVar20 = xmlGetIntSubset(ctxt->myDoc), pxVar20 == (xmlDtdPtr)0x0)) {
    pxVar20 = xmlCreateIntSubset(ctxt->myDoc,"html",
                                 (xmlChar *)"-//W3C//DTD HTML 4.0 Transitional//EN",
                                 (xmlChar *)"http://www.w3.org/TR/REC-html40/loose.dtd");
    ctxt->myDoc->intSubset = pxVar20;
  }
  if (terminate != 0) {
    xVar12 = ctxt->instate;
    if (xVar12 != XML_PARSER_EOF) {
      if ((xVar12 != XML_PARSER_MISC) && (xVar12 != XML_PARSER_EPILOG)) {
        ctxt->errNo = 5;
        ctxt->wellFormed = 0;
      }
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var8 = ctxt->sax->endDocument, p_Var8 != (endDocumentSAXFunc)0x0)) {
        (*p_Var8)(ctxt->userData);
      }
    }
    ctxt->instate = XML_PARSER_EOF;
  }
  return ctxt->errNo;
}

Assistant:

int
htmlParseChunk(htmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    if ((ctxt == NULL) || (ctxt->input == NULL)) {
	htmlParseErr(ctxt, XML_ERR_INTERNAL_ERROR,
		     "htmlParseChunk: context error\n", NULL, NULL);
	return(XML_ERR_INTERNAL_ERROR);
    }
    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    ctxt->disableSAX = 1;
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "HPP: pushed %d\n", size);
#endif

#if 0
	if ((terminate) || (ctxt->input->buf->buffer->use > 80))
	    htmlParseTryOrFinish(ctxt, terminate);
#endif
    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
			         "encoder error\n", NULL, NULL);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    htmlParseTryOrFinish(ctxt, terminate);
    if (terminate) {
	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG) &&
	    (ctxt->instate != XML_PARSER_MISC)) {
	    ctxt->errNo = XML_ERR_DOCUMENT_END;
	    ctxt->wellFormed = 0;
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    return((xmlParserErrors) ctxt->errNo);
}